

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O1

void __thiscall
btAlignedObjectArray<float>::copyFromArray
          (btAlignedObjectArray<float> *this,btAlignedObjectArray<float> *otherArray)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  ulong uVar7;
  
  uVar1 = otherArray->m_size;
  iVar2 = this->m_size;
  if ((iVar2 <= (int)uVar1) && (iVar2 < (int)uVar1)) {
    if (this->m_capacity < (int)uVar1) {
      if (uVar1 == 0) {
        pfVar5 = (float *)0x0;
      }
      else {
        pfVar5 = (float *)btAlignedAllocInternal((long)(int)uVar1 * 4,0x10);
      }
      iVar3 = this->m_size;
      if (0 < (long)iVar3) {
        pfVar4 = this->m_data;
        lVar6 = 0;
        do {
          pfVar5[lVar6] = pfVar4[lVar6];
          lVar6 = lVar6 + 1;
        } while (iVar3 != lVar6);
      }
      if (this->m_data != (float *)0x0) {
        if (this->m_ownsMemory == true) {
          btAlignedFreeInternal(this->m_data);
        }
        this->m_data = (float *)0x0;
      }
      this->m_ownsMemory = true;
      this->m_data = pfVar5;
      this->m_capacity = uVar1;
    }
    if (iVar2 < (int)uVar1) {
      memset(this->m_data + iVar2,0,((long)(int)uVar1 - (long)iVar2) * 4);
    }
  }
  this->m_size = uVar1;
  if (0 < (int)uVar1) {
    pfVar5 = this->m_data;
    pfVar4 = otherArray->m_data;
    uVar7 = 0;
    do {
      pfVar5[uVar7] = pfVar4[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  return;
}

Assistant:

void copyFromArray(const btAlignedObjectArray& otherArray)
	{
		int otherSize = otherArray.size();
		resize (otherSize);
		otherArray.copy(0, otherSize, m_data);
	}